

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

void __thiscall
flatbuffers::java::JavaGenerator::GenStructPackCall_ObjectAPI
          (JavaGenerator *this,StructDef *struct_def,string *code,string *prefix)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Value *local_48;
  Type *field_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_30;
  const_iterator it;
  string *prefix_local;
  string *code_local;
  StructDef *struct_def_local;
  JavaGenerator *this_local;
  
  it._M_current = (FieldDef **)prefix;
  local_30._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_30);
    field_type = (Type *)*ppFVar2;
    local_48 = &((FieldDef *)field_type)->value;
    if ((((FieldDef *)field_type)->value).type.struct_def == (StructDef *)0x0) {
      std::__cxx11::string::operator+=((string *)code,",\n");
      IdlNamer::Field_abi_cxx11_(&local_f8,&this->namer_,(FieldDef *)field_type);
      std::operator+(&local_d8,prefix,&local_f8);
      std::__cxx11::string::operator+=((string *)code,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      struct_def_00 = (((FieldDef *)field_type)->value).type.struct_def;
      IdlNamer::Field_abi_cxx11_(&local_a8,&this->namer_,(FieldDef *)field_type);
      std::operator+(&local_88,prefix,&local_a8);
      std::operator+(&local_68,&local_88,"_");
      GenStructPackCall_ObjectAPI(this,struct_def_00,code,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void GenStructPackCall_ObjectAPI(const StructDef &struct_def,
                                   std::string &code,
                                   std::string prefix) const {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field_type.struct_def != nullptr) {
        GenStructPackCall_ObjectAPI(*field_type.struct_def, code,
                                    prefix + namer_.Field(field) + "_");
      } else {
        code += ",\n";
        code += prefix + namer_.Field(field);
      }
    }
  }